

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::flatten
          (SceneGraph *this,Ref<embree::SceneGraph::Node> *node,InstancingMode mode)

{
  Ref<embree::SceneGraph::Node> local_88;
  SceneGraphFlattener local_80;
  
  local_88 = (Ref<embree::SceneGraph::Node>)node->ptr;
  if (local_88.ptr != (Node *)0x0) {
    (*((local_88.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  SceneGraphFlattener::SceneGraphFlattener(&local_80,&local_88,mode);
  *(Node **)this = local_80.node.ptr;
  local_80.node.ptr = (Node *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_80.unique_id._M_t);
  std::
  _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  ::~_Rb_tree(&local_80.object_mapping._M_t);
  if (local_80.node.ptr != (Node *)0x0) {
    (*((local_80.node.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  if (local_88.ptr != (Node *)0x0) {
    (*((local_88.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::flatten(Ref<Node> node, InstancingMode mode) {
    return SceneGraphFlattener(node,mode).node;
  }